

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Base64.cpp
# Opt level: O2

size_t Jupiter_base64decode(char *in,uchar *out)

{
  char cVar1;
  byte bVar2;
  uchar *puVar3;
  sbyte sVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  uchar *puVar8;
  long lVar9;
  
  puVar3 = out;
  do {
    uVar6 = 1;
    do {
      do {
        cVar1 = *in;
        uVar5 = (uint)uVar6;
        if ((long)cVar1 == 0) {
LAB_00134ccf:
          if ((uVar5 >> 0x12 & 1) == 0) {
            if ((uVar5 >> 0xc & 1) == 0) goto LAB_00134d14;
            lVar9 = 1;
            sVar4 = 4;
            puVar8 = puVar3;
          }
          else {
            puVar8 = puVar3 + 1;
            *puVar3 = (uchar)(uVar6 >> 10);
            sVar4 = 2;
            lVar9 = 2;
          }
          puVar3 = puVar3 + lVar9;
          *puVar8 = (uchar)(uVar6 >> sVar4);
LAB_00134d14:
          return (long)puVar3 - (long)out;
        }
        in = in + 1;
        bVar2 = "BBBBBBBBB@BBBBBBBBBBBBBBBBBBBBBBBBBBBBBBBBB>BBB?456789:;<=BBBABBB"[cVar1];
      } while (bVar2 == 0x40);
      if (bVar2 == 0x41) goto LAB_00134ccf;
      if (bVar2 == 0x42) {
        return 0;
      }
      uVar7 = uVar6 << 6;
      uVar6 = bVar2 | uVar7;
    } while ((uVar5 >> 0x12 & 1) == 0);
    *puVar3 = (uchar)(uVar7 >> 0x10);
    puVar3[1] = (uchar)(uVar7 >> 8);
    puVar3[2] = (uchar)uVar6;
    puVar3 = puVar3 + 3;
  } while( true );
}

Assistant:

size_t Jupiter_base64decode(const char *in, unsigned char *out)
{
	unsigned char *outOrig = out;
	size_t buf = 1;

	while (*in != 0)
	{
		unsigned char c = Jupiter_base64DecodeTable[*in++];

		switch (c)
		{
		case 66:
			/* invalid input */
			return 0;
		case 65:
			/* pad character, end of data */
			goto endLoop;
		case 64:
			break;
		default:
			buf = buf << 6 | c;

			/* If the buffer is full, split it into bytes */
			if (buf & 0x1000000)
			{
				*out++ = (unsigned char)(buf >> 16);
				*out++ = (unsigned char)(buf >> 8);
				*out++ = (unsigned char)buf;
				buf = 1;
			}
			break;
		}
	}
endLoop:

	if (buf & 0x40000)
	{
		*out++ = (unsigned char)(buf >> 10);
		*out++ = (unsigned char)(buf >> 2);
	}
	else if (buf & 0x1000) *out++ = (unsigned char)(buf >> 4);

	return out - outOrig;
}